

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_random(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  t_float *ptVar2;
  t_float *ptVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  t_float *ptVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  char *fmt;
  t_float tVar13;
  long lVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  
  lVar10 = argv->ex_type;
  if (lVar10 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar8 = (optr->ex_cont).v_vec;
    }
    else {
      if (optr->ex_type == 0xe) {
LAB_001a0dee:
        post("expr~: Int. error %d",0x3da);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar8 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar8;
    }
    ptVar3 = (argv->ex_cont).v_vec;
    lVar10 = argv[1].ex_type;
    if (lVar10 - 0xeU < 2) {
      iVar12 = e->exp_vsize;
      if (iVar12 == 0) {
        return;
      }
      ptVar2 = argv[1].ex_cont.v_vec;
      lVar10 = 0;
      do {
        fVar15 = ptVar3[lVar10];
        fVar1 = ptVar2[lVar10];
        uVar7 = rand();
        ptVar8[lVar10] =
             (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)fVar1 - (int)fVar15) *
                          3.0517578e-05) + (int)fVar15);
        lVar10 = lVar10 + 1;
      } while (iVar12 != (int)lVar10);
      return;
    }
    if (lVar10 == 2) {
      iVar12 = e->exp_vsize;
      if (iVar12 == 0) {
        return;
      }
      fVar15 = argv[1].ex_cont.v_flt;
      lVar10 = 0;
      do {
        fVar1 = ptVar3[lVar10];
        uVar7 = rand();
        ptVar8[lVar10] =
             (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)fVar15 - (int)fVar1) *
                          3.0517578e-05) + (int)fVar1);
        lVar10 = lVar10 + 1;
      } while (iVar12 != (int)lVar10);
      return;
    }
    if (lVar10 == 1) {
      iVar12 = e->exp_vsize;
      if (iVar12 == 0) {
        return;
      }
      lVar10 = argv[1].ex_cont.v_int;
      lVar14 = 0;
      do {
        fVar15 = ptVar3[lVar14];
        uVar7 = rand();
        ptVar8[lVar14] =
             (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)(float)lVar10 - (int)fVar15) *
                          3.0517578e-05) + (int)fVar15);
        lVar14 = lVar14 + 1;
      } while (iVar12 != (int)lVar14);
      return;
    }
  }
  else if (lVar10 == 2) {
    lVar10 = argv[1].ex_type;
    if (lVar10 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_001a0dee;
        optr->ex_type = 0xf;
        ptVar8 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar8;
      }
      iVar12 = e->exp_vsize;
      if (iVar12 == 0) {
        return;
      }
      fVar15 = (argv->ex_cont).v_flt;
      ptVar8 = (optr->ex_cont).v_vec;
      ptVar3 = argv[1].ex_cont.v_vec;
      lVar10 = 0;
      do {
        fVar1 = ptVar3[lVar10];
        uVar7 = rand();
        ptVar8[lVar10] =
             (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)fVar1 - (int)fVar15) *
                          3.0517578e-05) + (int)fVar15);
        lVar10 = lVar10 + 1;
      } while (iVar12 != (int)lVar10);
      return;
    }
    if (lVar10 == 2) {
      if (optr->ex_type == 0xf) {
        fVar15 = (argv->ex_cont).v_flt;
        ptVar8 = (optr->ex_cont).v_vec;
        fVar1 = argv[1].ex_cont.v_flt;
        uVar7 = rand();
        auVar6 = _DAT_001b53a0;
        auVar5 = _DAT_001b5390;
        auVar4 = _DAT_001b5380;
        uVar9 = (ulong)(uint)e->exp_vsize;
        if (uVar9 == 0) {
          return;
        }
        fVar15 = (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)fVar1 - (int)fVar15) *
                              3.0517578e-05) + (int)fVar15);
        lVar10 = uVar9 - 1;
        auVar23._8_4_ = (int)lVar10;
        auVar23._0_8_ = lVar10;
        auVar23._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar23 = auVar23 ^ _DAT_001b53a0;
        do {
          auVar22._8_4_ = (int)uVar11;
          auVar22._0_8_ = uVar11;
          auVar22._12_4_ = (int)(uVar11 >> 0x20);
          auVar17 = (auVar22 | auVar5) ^ auVar6;
          iVar12 = auVar23._4_4_;
          if ((bool)(~(auVar17._4_4_ == iVar12 && auVar23._0_4_ < auVar17._0_4_ ||
                      iVar12 < auVar17._4_4_) & 1)) {
            ptVar8[uVar11] = fVar15;
          }
          if ((auVar17._12_4_ != auVar23._12_4_ || auVar17._8_4_ <= auVar23._8_4_) &&
              auVar17._12_4_ <= auVar23._12_4_) {
            ptVar8[uVar11 + 1] = fVar15;
          }
          auVar22 = (auVar22 | auVar4) ^ auVar6;
          iVar24 = auVar22._4_4_;
          if (iVar24 <= iVar12 && (iVar24 != iVar12 || auVar22._0_4_ <= auVar23._0_4_)) {
            ptVar8[uVar11 + 2] = fVar15;
            ptVar8[uVar11 + 3] = fVar15;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar11);
        return;
      }
      optr->ex_type = 2;
      iVar12 = (int)(argv->ex_cont).v_flt;
LAB_001a0d9f:
      tVar13 = (t_float)(int)argv[1].ex_cont.v_flt;
LAB_001a0da5:
      uVar7 = rand();
      (optr->ex_cont).v_flt =
           (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)tVar13 - iVar12) * 3.0517578e-05) +
                  iVar12);
      return;
    }
    if (lVar10 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar8 = (optr->ex_cont).v_vec;
        fVar15 = (argv->ex_cont).v_flt;
        tVar13 = argv[1].ex_cont.v_flt;
        uVar7 = rand();
        auVar6 = _DAT_001b53a0;
        auVar5 = _DAT_001b5390;
        auVar4 = _DAT_001b5380;
        uVar9 = (ulong)(uint)e->exp_vsize;
        if (uVar9 == 0) {
          return;
        }
        fVar15 = (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)tVar13 - (int)fVar15) *
                              3.0517578e-05) + (int)fVar15);
        lVar10 = uVar9 - 1;
        auVar17._8_4_ = (int)lVar10;
        auVar17._0_8_ = lVar10;
        auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar17 = auVar17 ^ _DAT_001b53a0;
        do {
          auVar20._8_4_ = (int)uVar11;
          auVar20._0_8_ = uVar11;
          auVar20._12_4_ = (int)(uVar11 >> 0x20);
          auVar23 = (auVar20 | auVar5) ^ auVar6;
          iVar12 = auVar17._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar12 && auVar17._0_4_ < auVar23._0_4_ ||
                      iVar12 < auVar23._4_4_) & 1)) {
            ptVar8[uVar11] = fVar15;
          }
          if ((auVar23._12_4_ != auVar17._12_4_ || auVar23._8_4_ <= auVar17._8_4_) &&
              auVar23._12_4_ <= auVar17._12_4_) {
            ptVar8[uVar11 + 1] = fVar15;
          }
          auVar23 = (auVar20 | auVar4) ^ auVar6;
          iVar24 = auVar23._4_4_;
          if (iVar24 <= iVar12 && (iVar24 != iVar12 || auVar23._0_4_ <= auVar17._0_4_)) {
            ptVar8[uVar11 + 2] = fVar15;
            ptVar8[uVar11 + 3] = fVar15;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar11);
        return;
      }
      optr->ex_type = 2;
      iVar12 = (int)(argv->ex_cont).v_flt;
      tVar13 = argv[1].ex_cont.v_flt;
      goto LAB_001a0da5;
    }
  }
  else {
    if (lVar10 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_001a0826;
    }
    lVar10 = argv[1].ex_type;
    if (lVar10 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_001a0dee;
        optr->ex_type = 0xf;
        ptVar8 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar8;
      }
      iVar12 = e->exp_vsize;
      if (iVar12 == 0) {
        return;
      }
      ptVar8 = (optr->ex_cont).v_vec;
      ptVar3 = argv[1].ex_cont.v_vec;
      lVar10 = (argv->ex_cont).v_int;
      lVar14 = 0;
      do {
        fVar15 = ptVar3[lVar14];
        uVar7 = rand();
        ptVar8[lVar14] =
             (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)fVar15 - (int)(float)lVar10) *
                          3.0517578e-05) + (int)(float)lVar10);
        lVar14 = lVar14 + 1;
      } while (iVar12 != (int)lVar14);
      return;
    }
    if (lVar10 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar8 = (optr->ex_cont).v_vec;
        iVar12 = *(int *)&argv->ex_cont;
        fVar15 = argv[1].ex_cont.v_flt;
        uVar7 = rand();
        auVar6 = _DAT_001b53a0;
        auVar5 = _DAT_001b5390;
        auVar4 = _DAT_001b5380;
        uVar9 = (ulong)(uint)e->exp_vsize;
        if (uVar9 == 0) {
          return;
        }
        fVar15 = (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)fVar15 - iVar12) *
                              3.0517578e-05) + iVar12);
        lVar10 = uVar9 - 1;
        auVar18._8_4_ = (int)lVar10;
        auVar18._0_8_ = lVar10;
        auVar18._12_4_ = (int)((ulong)lVar10 >> 0x20);
        uVar11 = 0;
        auVar18 = auVar18 ^ _DAT_001b53a0;
        do {
          auVar21._8_4_ = (int)uVar11;
          auVar21._0_8_ = uVar11;
          auVar21._12_4_ = (int)(uVar11 >> 0x20);
          auVar23 = (auVar21 | auVar5) ^ auVar6;
          iVar12 = auVar18._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar12 && auVar18._0_4_ < auVar23._0_4_ ||
                      iVar12 < auVar23._4_4_) & 1)) {
            ptVar8[uVar11] = fVar15;
          }
          if ((auVar23._12_4_ != auVar18._12_4_ || auVar23._8_4_ <= auVar18._8_4_) &&
              auVar23._12_4_ <= auVar18._12_4_) {
            ptVar8[uVar11 + 1] = fVar15;
          }
          auVar23 = (auVar21 | auVar4) ^ auVar6;
          iVar24 = auVar23._4_4_;
          if (iVar24 <= iVar12 && (iVar24 != iVar12 || auVar23._0_4_ <= auVar18._0_4_)) {
            ptVar8[uVar11 + 2] = fVar15;
            ptVar8[uVar11 + 3] = fVar15;
          }
          uVar11 = uVar11 + 4;
        } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar11);
        return;
      }
      optr->ex_type = 2;
      iVar12 = *(int *)&argv->ex_cont;
      goto LAB_001a0d9f;
    }
    if (lVar10 == 1) {
      if (optr->ex_type != 0xf) {
        optr->ex_type = 1;
        iVar12 = *(int *)&argv->ex_cont;
        tVar13 = argv[1].ex_cont.v_flt;
        uVar7 = rand();
        optr->ex_cont =
             (anon_union_8_5_735de1bb_for_ex_cont)
             (long)((int)((float)(uVar7 & 0x7fff) * (float)((int)tVar13 - iVar12) * 3.0517578e-05) +
                   iVar12);
        return;
      }
      ptVar8 = (optr->ex_cont).v_vec;
      iVar12 = *(int *)&argv->ex_cont;
      tVar13 = argv[1].ex_cont.v_flt;
      uVar7 = rand();
      auVar6 = _DAT_001b53a0;
      auVar5 = _DAT_001b5390;
      auVar4 = _DAT_001b5380;
      uVar9 = (ulong)(uint)e->exp_vsize;
      if (uVar9 == 0) {
        return;
      }
      fVar15 = (float)((int)((float)(uVar7 & 0x7fff) * (float)((int)tVar13 - iVar12) * 3.0517578e-05
                            ) + iVar12);
      lVar10 = uVar9 - 1;
      auVar16._8_4_ = (int)lVar10;
      auVar16._0_8_ = lVar10;
      auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
      uVar11 = 0;
      auVar16 = auVar16 ^ _DAT_001b53a0;
      do {
        auVar19._8_4_ = (int)uVar11;
        auVar19._0_8_ = uVar11;
        auVar19._12_4_ = (int)(uVar11 >> 0x20);
        auVar23 = (auVar19 | auVar5) ^ auVar6;
        iVar12 = auVar16._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar12 && auVar16._0_4_ < auVar23._0_4_ ||
                    iVar12 < auVar23._4_4_) & 1)) {
          ptVar8[uVar11] = fVar15;
        }
        if ((auVar23._12_4_ != auVar16._12_4_ || auVar23._8_4_ <= auVar16._8_4_) &&
            auVar23._12_4_ <= auVar16._12_4_) {
          ptVar8[uVar11 + 1] = fVar15;
        }
        auVar23 = (auVar19 | auVar4) ^ auVar6;
        iVar24 = auVar23._4_4_;
        if (iVar24 <= iVar12 && (iVar24 != iVar12 || auVar23._0_4_ <= auVar16._0_4_)) {
          ptVar8[uVar11 + 2] = fVar15;
          ptVar8[uVar11 + 3] = fVar15;
        }
        uVar11 = uVar11 + 4;
      } while ((uVar9 + 3 & 0xfffffffffffffffc) != uVar11);
      return;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_001a0826:
  pd_error(e,fmt,0x3da);
  return;
}

Assistant:

static void
ex_random(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, ex_dorandom, (int), (int), optr, 0);
}